

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_A_FreezeDeathChunks(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  VM_UBYTE VVar4;
  DObject *this;
  player_t *ppVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  APlayerPawn *this_00;
  AActor *pAVar14;
  FState *pFVar15;
  int iVar16;
  AActor *ent;
  char *__assertion;
  AActor *unaff_R12;
  long lVar17;
  VMValue params [3];
  FName local_40;
  FName local_3c;
  FName local_38;
  FSoundID local_34;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00556d3e;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00556d2e;
  ent = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_0055687c;
    bVar10 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar10) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00556d3e;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_00556d2e;
LAB_0055687c:
    ent = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_005568fc;
  VVar4 = param[1].field_0.field_3.Type;
  if (VVar4 != 0xff) {
    if (VVar4 != '\x03') {
LAB_00556d2e:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00556d3e;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar10 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar10)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00556d3e;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_00556d2e;
  }
  if ((((uint)numparam < 3) || (VVar4 = param[2].field_0.field_3.Type, VVar4 == 0xff)) ||
     ((VVar4 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005568fc:
    bVar10 = TVector3<double>::isZero(&ent->Vel);
    if ((bVar10) || (((ent->flags6).Value & 0x20000) != 0)) {
      (ent->Vel).X = 0.0;
      (ent->Vel).Y = 0.0;
      (ent->Vel).Z = 0.0;
      local_34.ID = S_FindSound("misc/icebreak");
      S_Sound(ent,4,&local_34,1.0,1.0);
      uVar6 = (long)(int)(ent->radius * ent->Height) / 0x20;
      uVar9 = 4;
      if (4 < (int)uVar6) {
        uVar9 = uVar6;
      }
      iVar11 = FRandom::Random2(&pr_freeze);
      iVar16 = iVar11 % (int)((uVar9 & 0xffffffff) >> 2) + (int)uVar9;
      iVar11 = 0x18;
      if (0x18 < iVar16) {
        iVar11 = iVar16;
      }
      for (; -1 < iVar11; iVar11 = iVar11 + -1) {
        iVar16 = FRandom::operator()(&pr_freeze);
        dVar1 = ent->radius;
        iVar12 = FRandom::operator()(&pr_freeze);
        dVar2 = ent->radius;
        iVar13 = FRandom::operator()(&pr_freeze);
        dVar3 = ent->Height;
        FName::FName(&local_38,"IceChunk");
        AActor::Vec3Offset((DVector3 *)params,ent,(double)(iVar16 + -0x80) * dVar1 * 0.0078125,
                           (double)(iVar12 + -0x80) * dVar2 * 0.0078125,
                           ((double)iVar13 * dVar3) / 255.0,false);
        unaff_R12 = Spawn(&local_38,(DVector3 *)params,ALLOW_REPLACE);
        if (unaff_R12 != (AActor *)0x0) {
          pFVar15 = unaff_R12->SpawnState;
          iVar16 = FRandom::operator()(&pr_freeze);
          AActor::SetState(unaff_R12,pFVar15 + iVar16 % 3,false);
          iVar16 = FRandom::Random2(&pr_freeze);
          (unaff_R12->Vel).X = (double)iVar16 * 0.0078125;
          iVar16 = FRandom::Random2(&pr_freeze);
          dVar1 = (((unaff_R12->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
          auVar7._8_4_ = SUB84(dVar1,0);
          auVar7._0_8_ = (double)iVar16 * 0.0078125;
          auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
          (unaff_R12->Vel).Y = (double)iVar16 * 0.0078125;
          (unaff_R12->Vel).Z = (double)auVar7._8_8_;
          params[1].field_0._8_4_ = 1;
          params[0].field_0._8_5_ = 0x300000001;
          params[1].field_0.field_3.Type = '\x03';
          params[2].field_0.field_1.a = (void *)0x0;
          params[2].field_0.field_1.atag = 8;
          params[2].field_0.field_3.Type = '\x03';
          params[0].field_0._0_8_ = unaff_R12;
          params[1].field_0._0_8_ = unaff_R12;
          VMFrameStack::Call(stack,&A_IceSetTics_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,0,
                             (VMException **)0x0);
          lVar17 = 0x20;
          do {
            VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar17));
            lVar17 = lVar17 + -0x10;
          } while (lVar17 != -0x10);
          unaff_R12->RenderStyle = ent->RenderStyle;
          unaff_R12->Alpha = ent->Alpha;
        }
      }
      if (ent->player != (player_t *)0x0) {
        FName::FName(&local_3c,"IceChunkHead");
        params[1].field_0._0_8_ = ent->player->mo->ViewHeight + (ent->__Pos).Z;
        params[0].field_0._0_8_ = (ent->__Pos).X;
        params[0].field_0._8_8_ = (ent->__Pos).Y;
        this_00 = (APlayerPawn *)Spawn(&local_3c,(DVector3 *)params,ALLOW_REPLACE);
        if (this_00 != (APlayerPawn *)0x0) {
          iVar11 = FRandom::Random2(&pr_freeze);
          ((DVector3 *)(&(this_00->super_AActor).super_DThinker + 3))->X =
               (double)iVar11 * 0.0078125;
          iVar11 = FRandom::Random2(&pr_freeze);
          dVar1 = (((unaff_R12->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
          auVar8._8_4_ = SUB84(dVar1,0);
          auVar8._0_8_ = (double)iVar11 * 0.0078125;
          auVar8._12_4_ = (int)((ulong)dVar1 >> 0x20);
          (this_00->super_AActor).Vel.Y = (double)iVar11 * 0.0078125;
          (this_00->super_AActor).Vel.Z = (double)auVar8._8_8_;
          *(int *)((long)(&(this_00->super_AActor).super_DThinker + 8) + 0xc) = ent->health;
          *(double *)((long)(&(this_00->super_AActor).super_DThinker + 2) + 0x20) =
               (ent->Angles).Yaw.Degrees;
          bVar10 = DObject::IsKindOf((DObject *)this_00,APlayerPawn::RegistrationInfo.MyClass);
          if (bVar10) {
            ppVar5 = ent->player;
            *(player_t **)((long)(&(this_00->super_AActor).super_DThinker + 9) + 8) = ppVar5;
            ppVar5->mo = this_00;
            ent->player = (player_t *)0x0;
            AActor::ObtainInventory((AActor *)this_00,ent);
          }
          (this_00->super_AActor).Angles.Pitch.Degrees = 0.0;
          (this_00->super_AActor).RenderStyle = ent->RenderStyle;
          (this_00->super_AActor).Alpha = ent->Alpha;
          pAVar14 = GC::ReadBarrier<AActor>((AActor **)&((this_00->super_AActor).player)->camera);
          if (pAVar14 == ent) {
            (((this_00->super_AActor).player)->camera).field_0.p = (AActor *)this_00;
          }
        }
      }
      if (((ent->flags4).Value & 8) != 0) {
        A_BossDeath(ent);
      }
      A_Unblock(ent,true);
      local_40.Index = 1;
      pFVar15 = AActor::FindState(ent,&local_40);
      AActor::SetState(ent,pFVar15,false);
    }
    else {
      ent->tics = 0x69;
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00556d3e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0x10f,"int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			CALL_ACTION(A_IceSetTics, mo); // set a random tic wait
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}